

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall aeron::ClientConductor::~ClientConductor(ClientConductor *this)

{
  iterator iVar1;
  iterator iVar2;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  in_RDI;
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  subscriptions;
  anon_class_8_1_67742916 in_stack_ffffffffffffff78;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  in_stack_ffffffffffffff80;
  CountersReader *this_00;
  DriverProxy *this_01;
  
  *(undefined ***)&(in_RDI._M_current)->m_channel = &PTR__ClientConductor_0022d700;
  std::
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ::vector((vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
            *)0x1c9499);
  this_01 = (DriverProxy *)&(in_RDI._M_current)->m_subscriptionCache;
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::begin((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           *)in_stack_ffffffffffffff78.subscriptions);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::end((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
         *)in_stack_ffffffffffffff78.subscriptions);
  std::
  for_each<__gnu_cxx::__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn*,std::vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>>,aeron::ClientConductor::~__normal_iterator()::__0>
            (in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (CountersReader *)
            ((long)&((in_RDI._M_current)->m_onUnavailableImageHandler).super__Function_base.
                    _M_functor + 8);
  iVar1 = std::
          vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
          ::begin((vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
                   *)in_stack_ffffffffffffff78.subscriptions);
  iVar2 = std::
          vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
          ::end((vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
                 *)in_stack_ffffffffffffff78.subscriptions);
  std::
  for_each<__gnu_cxx::__normal_iterator<aeron::ClientConductor::ImageListLingerDefn*,std::vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>>,aeron::ClientConductor::~__normal_iterator()::__1>
            (iVar1._M_current,iVar2._M_current);
  DriverProxy::clientClose(this_01);
  std::
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ::~vector((vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
             *)this_01);
  std::function<long_long_()>::~function((function<long_long_()> *)0x1c955b);
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::~function
            ((function<void_(aeron::concurrent::CountersReader_&,_long,_int)> *)
             &in_RDI._M_current[2].m_status);
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::~function
            ((function<void_(aeron::concurrent::CountersReader_&,_long,_int)> *)
             ((long)&in_RDI._M_current[2].m_channel.field_2 + 8));
  std::function<void_(const_std::exception_&)>::~function
            ((function<void_(const_std::exception_&)> *)
             &in_RDI._M_current[1].m_onUnavailableImageHandler._M_invoker);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
               *)&in_RDI._M_current[1].m_onAvailableImageHandler._M_invoker);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
               *)&in_RDI._M_current[1].m_subscription.
                  super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
               *)((long)&in_RDI._M_current[1].m_errorMessage.field_2 + 8));
  concurrent::CountersReader::~CountersReader(this_00);
  std::
  vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
  ::~vector((vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
             *)this_01);
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::~vector((vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
             *)this_01);
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::~vector((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
             *)this_01);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::~vector((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
             *)this_01);
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::~vector((vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
             *)this_01);
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::~vector((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
             *)this_01);
  return;
}

Assistant:

ClientConductor::~ClientConductor()
{
    std::vector<std::shared_ptr<Subscription>> subscriptions;

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&subscriptions](SubscriptionStateDefn& entry)
        {
            subscriptions.push_back(entry.m_subscriptionCache);
            entry.m_subscriptionCache.reset();
        });

    std::for_each(m_lingeringImageLists.begin(), m_lingeringImageLists.end(),
        [](ImageListLingerDefn & entry)
        {
            delete[] entry.m_imageList->m_images;
            delete entry.m_imageList;
            entry.m_imageList = nullptr;
        });

    m_driverProxy.clientClose();
}